

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_setopt.c
# Opt level: O0

CURLcode libcurl_generate_mime(CURL *curl,GlobalConfig *config,tool_mime *toolmime,int *mimeno)

{
  CURLcode local_2c;
  CURLcode ret;
  int *mimeno_local;
  tool_mime *toolmime_local;
  GlobalConfig *config_local;
  CURL *curl_local;
  
  easysrc_mime_count = easysrc_mime_count + 1;
  *mimeno = easysrc_mime_count;
  local_2c = easysrc_addf(&easysrc_decl,"curl_mime *mime%d;",(ulong)(uint)*mimeno);
  if ((((local_2c == CURLE_OK) &&
       (local_2c = easysrc_addf(&easysrc_data,"mime%d = NULL;",(ulong)(uint)*mimeno),
       local_2c == CURLE_OK)) &&
      (local_2c = easysrc_addf(&easysrc_code,"mime%d = curl_mime_init(hnd);",(ulong)(uint)*mimeno),
      local_2c == CURLE_OK)) &&
     (((local_2c = easysrc_addf(&easysrc_clean,"curl_mime_free(mime%d);",(ulong)(uint)*mimeno),
       local_2c == CURLE_OK &&
       (local_2c = easysrc_addf(&easysrc_clean,"mime%d = NULL;",(ulong)(uint)*mimeno),
       local_2c == CURLE_OK)) &&
      ((toolmime->subparts != (tool_mime *)0x0 &&
       (local_2c = easysrc_addf(&easysrc_decl,"curl_mimepart *part%d;",(ulong)(uint)*mimeno),
       local_2c == CURLE_OK)))))) {
    local_2c = libcurl_generate_mime_part(curl,config,toolmime->subparts,*mimeno);
  }
  return local_2c;
}

Assistant:

static CURLcode libcurl_generate_mime(CURL *curl,
                                      struct GlobalConfig *config,
                                      tool_mime *toolmime,
                                      int *mimeno)
{
  CURLcode ret = CURLE_OK;

  /* May need several mime variables, so invent name. */
  *mimeno = ++easysrc_mime_count;
  DECL1("curl_mime *mime%d;", *mimeno);
  DATA1("mime%d = NULL;", *mimeno);
  CODE1("mime%d = curl_mime_init(hnd);", *mimeno);
  CLEAN1("curl_mime_free(mime%d);", *mimeno);
  CLEAN1("mime%d = NULL;", *mimeno);

  if(toolmime->subparts) {
    DECL1("curl_mimepart *part%d;", *mimeno);
    ret = libcurl_generate_mime_part(curl, config,
                                     toolmime->subparts, *mimeno);
  }

nomem:
  return ret;
}